

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::Expression> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Expression>(RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  Number *pNVar4;
  undefined1 auVar5 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  SyntaxError *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  long in_RSI;
  long lVar9;
  char *pcVar10;
  shared_ptr<MyCompiler::Term> sVar11;
  shared_ptr<MyCompiler::Expression> sVar12;
  shared_ptr<MyCompiler::Term> p2;
  shared_ptr<MyCompiler::AddSubOp> p1;
  undefined1 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  istream local_68 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  istream *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Expression,std::allocator<MyCompiler::Expression>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Expression **)this,
             (allocator<MyCompiler::Expression> *)local_78);
  if (*(int *)(in_RSI + 0x30) - 3U < 2) {
    parse<MyCompiler::AddSubOp>((RecursiveDescentParser *)local_78);
    p_Var6 = p_Stack_70;
    auVar5 = local_78;
    piVar1 = this->stream;
    local_78 = (undefined1  [8])0x0;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
    *(undefined1 (*) [8])(piVar1 + 0x48) = auVar5;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50) = p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
  }
  sVar11 = parse<MyCompiler::Term>((RecursiveDescentParser *)local_78);
  p_Var6 = p_Stack_70;
  auVar5 = local_78;
  _Var8 = sVar11.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  piVar1 = this->stream;
  local_78 = (undefined1  [8])0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x60);
  *(undefined1 (*) [8])(piVar1 + 0x58) = auVar5;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x60) = p_Var6;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     _Var8._M_pi = extraout_RDX, p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    _Var8._M_pi = extraout_RDX_00;
  }
  lVar3 = *(long *)(this->stream + 0x48);
  if (((lVar3 != 0) &&
      (lVar9 = *(long *)(this->stream + 0x58), *(int *)(*(long *)(lVar9 + 0x48) + 4) == 1)) &&
     (*(long *)(lVar9 + 0x58) == *(long *)(lVar9 + 0x60))) {
    iVar7 = std::__cxx11::string::compare((char *)(lVar3 + 0x28));
    _Var8._M_pi = extraout_RDX_01;
    if (iVar7 == 0) {
      pNVar4 = *(Number **)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58);
      Number::setNum(pNVar4,-pNVar4->num);
      _Var8._M_pi = extraout_RDX_02;
    }
    piVar1 = this->stream;
    *(undefined8 *)(piVar1 + 0x48) = 0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
    *(undefined8 *)(piVar1 + 0x50) = 0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var8._M_pi = extraout_RDX_03;
    }
  }
  if (*(int *)(in_RSI + 0x30) - 3U < 2) {
    do {
      parse<MyCompiler::AddSubOp>((RecursiveDescentParser *)&local_40);
      parse<MyCompiler::Term>((RecursiveDescentParser *)(local_68 + 0x18));
      piVar1 = this->stream;
      if (((*(int *)(*(long *)(*(long *)(piVar1 + 0x58) + 0x48) + 4) == 1) &&
          (*(long *)(piVar1 + 0x68) == *(long *)(piVar1 + 0x70))) &&
         (((((((shared_ptr<MyCompiler::Factor> *)(local_68._24_8_ + 0x48))->
             super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           super_AbstractAstNode).caseNum == 1 &&
          ((((vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
              *)(local_68._24_8_ + 0x58))->
           super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           )._M_impl.super__Vector_impl_data._M_start == *(pointer *)(local_68._24_8_ + 0x60))))) {
        iVar7 = std::__cxx11::string::compare((char *)(local_40 + 0x28));
        lVar3 = ((((((shared_ptr<MyCompiler::Factor> *)(local_68._24_8_ + 0x48))->
                   super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 pNumber).super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->num;
        pNVar4 = *(Number **)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58);
        lVar9 = -lVar3;
        if (iVar7 == 0) {
          lVar9 = lVar3;
        }
        Number::setNum(pNVar4,lVar9 + pNVar4->num);
        lVar3 = *(long *)(*(long *)(*(long *)(*(long *)(this->stream + 0x58) + 0x48) + 0x58) + 0x48)
        ;
        _Var8._M_pi = extraout_RDX_04;
        if ((int)lVar3 != lVar3) {
          this_00 = (SyntaxError *)__cxa_allocate_exception(0x10);
          iVar7 = std::__cxx11::string::compare((char *)(local_40 + 0x28));
          pcVar10 = "attempt to subtract with overflow";
          if (iVar7 == 0) {
            pcVar10 = "attempt to add with overflow";
          }
          local_78 = (undefined1  [8])local_68;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,pcVar10,pcVar10 + (ulong)(iVar7 != 0) * 5 + 0x1c);
          SyntaxError::SyntaxError(this_00,(string *)local_78);
          __cxa_throw(this_00,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        std::
        vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
        ::emplace_back<MyCompiler::AddSubOp&,MyCompiler::Term&>
                  ((vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
                    *)(piVar1 + 0x68),(AddSubOp *)local_40,(Term *)local_68._24_8_);
        _Var8._M_pi = extraout_RDX_05;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        _Var8._M_pi = extraout_RDX_06;
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        _Var8._M_pi = extraout_RDX_07;
      }
    } while (*(int *)(in_RSI + 0x30) - 3U < 2);
  }
  sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Expression>)
         sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Expression> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Expression>();

    if (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
        pResult->pAddSubOp = parse<AddSubOp>();
    pResult->pTerm = parse<Term>();
    if (pResult->pAddSubOp != nullptr && pResult->pTerm->pFactor->caseNum == 1 &&
        pResult->pTerm->vMulDivOpFactor.empty())
    {
        if (pResult->pAddSubOp->value == "-")
            pResult->pTerm->pFactor->pNumber->setNum(-pResult->pTerm->pFactor->pNumber->num);
        pResult->pAddSubOp = nullptr;
    }
    while (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
    {
        auto p1 = parse<AddSubOp>();
        auto p2 = parse<Term>();
        if (pResult->pTerm->pFactor->caseNum == 1 && pResult->vAddSubOpExpression.empty() &&
            p2->pFactor->caseNum == 1 && p2->vMulDivOpFactor.empty())
        {
            if (p1->value == "+")
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num + p2->pFactor->pNumber->num);
            else
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num - p2->pFactor->pNumber->num);
            if (pResult->pTerm->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pTerm->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "+" ? "attempt to add with overflow" : "attempt to subtract with overflow");
        }
        else
            pResult->vAddSubOpExpression.emplace_back(*p1, *p2);
    }

    return pResult;
}